

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TransferTree(InnerMap *this,void **table,size_type index)

{
  bool bVar1;
  reference ppMVar2;
  MapKey *in_RDI;
  Node *node;
  iterator tree_it;
  Tree *tree;
  Node *in_stack_00000120;
  size_type in_stack_00000128;
  InnerMap *in_stack_00000130;
  Tree *in_stack_ffffffffffffff98;
  InnerMap *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffb0;
  
  std::
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  ::begin(in_stack_ffffffffffffff98);
  do {
    ppMVar2 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                        ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)
                         in_stack_ffffffffffffffa0);
    NodePtrFromKeyPtr(*ppMVar2);
    std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
              ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)in_stack_ffffffffffffffa0);
    BucketNumber((InnerMap *)in_stack_ffffffffffffffb0._M_node,in_RDI);
    InsertUnique(in_stack_00000130,in_stack_00000128,in_stack_00000120);
    in_stack_ffffffffffffffa0 =
         (InnerMap *)
         std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator++
                   ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)in_stack_ffffffffffffffa0
                   );
    in_stack_ffffffffffffffb0 =
         std::
         set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffffa0,(_Self *)&stack0xffffffffffffffb0);
  } while (bVar1);
  DestroyTree(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        Node* node = NodePtrFromKeyPtr(*tree_it);
        InsertUnique(BucketNumber(**tree_it), node);
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }